

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O1

void spell_word_of_recall(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  char *txt;
  CHAR_DATA *victim;
  ROOM_INDEX_DATA *location;
  CHAR_DATA *local_68;
  ROOM_INDEX_DATA *local_60;
  string local_58;
  string local_38;
  
  local_68 = (CHAR_DATA *)vo;
  bVar1 = trusts(ch,(CHAR_DATA *)vo);
  if (!bVar1) {
    txt = "They won\'t allow you to do that to them.\n\r";
    goto LAB_002b708a;
  }
  local_60 = get_room_index(0);
  if (local_60 == (ROOM_INDEX_DATA *)0x0) {
    local_60 = get_room_index(0);
    if (local_60 == (ROOM_INDEX_DATA *)0x0) {
      txt = "You are completely lost.\n\r";
      ch = local_68;
      goto LAB_002b708a;
    }
  }
  if ((local_68->in_room->room_flags[0] & 0x2000) == 0) {
LAB_002b7040:
    bVar1 = is_affected_room(ch->in_room,(int)gsn_plasma_cube);
    if (bVar1) {
      iVar2 = number_percent();
      if (iVar2 < 0x32) goto LAB_002b7072;
    }
    bVar1 = is_npc(local_68);
    if (!bVar1) {
      bVar1 = is_affected(local_68,(int)gsn_bind_feet);
      if (!bVar1) {
        if (local_68 != ch) {
          act("You prepare to send $N home.",ch,(void *)0x0,local_68,3);
        }
        local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_38,"spell_word_of_recall","");
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"recall_execute","");
        CQueue::AddToQueue<void(*)(char_data*,room_index_data*),char_data*&,room_index_data*&>
                  (&RS.Queue,6,&local_38,&local_58,recall_execute,&local_68,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
        send_to_char("A tingling feeling runs down your spine for a moment.\n\r",local_68);
        local_68->disrupted = false;
        return;
      }
      txt = "Your feet are rooted to the ground!\n\r";
      ch = local_68;
      goto LAB_002b708a;
    }
  }
  else {
    bVar1 = is_affected_room(ch->in_room,(int)gsn_consecrate);
    if (bVar1) goto LAB_002b7040;
  }
LAB_002b7072:
  txt = "Spell failed.\n\r";
  ch = local_68;
LAB_002b708a:
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_word_of_recall(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	ROOM_INDEX_DATA *location;

	if (!trusts(ch, victim))
	{
		send_to_char("They won't allow you to do that to them.\n\r", ch);
		return;
	}

	location = get_room_index(hometown_table[victim->hometown].recall);

	if (location == nullptr)
	{
		location = get_room_index(ROOM_VNUM_TEMPLE);

		if (location == nullptr)
		{
			send_to_char("You are completely lost.\n\r", victim);
			return;
		}
	}

	if ((IS_SET(victim->in_room->room_flags, ROOM_NO_RECALL) && !is_affected_room(ch->in_room, gsn_consecrate))
		|| (is_affected_room(ch->in_room, gsn_plasma_cube) && number_percent() < 50)
		|| is_npc(victim))
	{
		send_to_char("Spell failed.\n\r", victim);
		return;
	}

	if (is_affected(victim, gsn_bind_feet))
	{
		send_to_char("Your feet are rooted to the ground!\n\r", victim);
		return;
	}

	if (ch != victim)
		act("You prepare to send $N home.", ch, 0, victim, TO_CHAR);

	RS.Queue.AddToQueue(6, "spell_word_of_recall", "recall_execute", recall_execute, victim, location);

	send_to_char("A tingling feeling runs down your spine for a moment.\n\r", victim);

	victim->disrupted = false;
}